

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O0

void __thiscall
OpenMD::BondOrderParameter::BondOrderParameter
          (BondOrderParameter *this,SimInfo *info,string *filename,string *sele,double rCut,
          uint nbins)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  key_type *__k;
  void *pvVar4;
  mapped_type *pmVar5;
  vector<double,_std::allocator<double>_> *this_00;
  string *in_RCX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined8 in_XMM0_Qa;
  double dVar6;
  int mmm;
  int ii;
  pair<int,_int> lm;
  int m1;
  int l;
  int mSize;
  int error;
  RealType m2M;
  RealType m2m;
  RealType m1Pass;
  RealType lPass;
  RealType *THRCOF;
  string paramString;
  stringstream params;
  string *in_stack_fffffffffffffc88;
  StaticAnalyser *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  StaticAnalyser *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcb0;
  allocator<char> *in_stack_fffffffffffffcc0;
  SelectionEvaluator *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffcd8;
  SelectionEvaluator *in_stack_fffffffffffffce0;
  int local_2b0;
  int local_2ac;
  int local_2a0;
  int local_29c;
  double local_290;
  double local_288;
  SimInfo *in_stack_fffffffffffffd88;
  SelectionEvaluator *in_stack_fffffffffffffd90;
  string local_268 [32];
  stringstream local_248 [16];
  ostream local_238 [56];
  int *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe0c;
  RealType *in_stack_fffffffffffffe10;
  RealType *in_stack_fffffffffffffe18;
  RealType *in_stack_fffffffffffffe20;
  RealType in_stack_fffffffffffffe28;
  RealType in_stack_fffffffffffffe30;
  RealType in_stack_fffffffffffffe38;
  RealType in_stack_fffffffffffffe40;
  SimInfo *in_stack_ffffffffffffff38;
  SelectionManager *in_stack_ffffffffffffff40;
  string local_a8 [32];
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [52];
  undefined4 local_2c;
  undefined8 local_28;
  string *local_20;
  
  local_2c = in_R8D;
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffca0,
             (SimInfo *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
             (string *)in_stack_fffffffffffffc90,(uint)((ulong)in_stack_fffffffffffffc88 >> 0x20));
  *in_RDI = &PTR__BondOrderParameter_0055e7e0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1a),local_20);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::map((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
         *)0x13c499);
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::map((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
         *)0x13c4b2);
  std::
  map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::map((map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
         *)0x13c4cb);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13c4e7);
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::map((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
         *)0x13c503);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13c51f);
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::map((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
         *)0x13c53b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  StaticAnalyser::setAnalysisType(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  getPrefix((string *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                 (char *)in_stack_fffffffffffffc90);
  StaticAnalyser::setOutputName(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  SelectionEvaluator::loadScriptString(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x37));
  if (!bVar1) {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffcc8);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffca0,
               (SelectionSet *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    SelectionSet::~SelectionSet((SelectionSet *)0x13c698);
  }
  in_RDI[0xe1] = local_28;
  *(undefined4 *)((long)in_RDI + 0x714) = local_2c;
  std::__cxx11::stringstream::stringstream(local_248);
  poVar3 = std::operator<<(local_238," rcut = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)in_RDI[0xe1]);
  __k = (key_type *)std::operator<<(poVar3,", nbins = ");
  std::ostream::operator<<(__k,*(int *)((long)in_RDI + 0x714));
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffcb0,CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
            );
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffcb0,CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
            );
  in_RDI[0xf5] = 0;
  in_RDI[0xf6] = 0x3ff199999999999a;
  in_RDI[0xf7] = ((double)in_RDI[0xf6] - (double)in_RDI[0xf5]) /
                 (double)*(int *)((long)in_RDI + 0x714);
  in_RDI[0x101] = 0xbff199999999999a;
  in_RDI[0x102] = 0x3ff199999999999a;
  in_RDI[0x103] =
       ((double)in_RDI[0x102] - (double)in_RDI[0x101]) / (double)*(int *)((long)in_RDI + 0x714);
  pvVar4 = operator_new__(200);
  for (local_29c = 0; local_29c < 0xd; local_29c = local_29c + 1) {
    for (local_2a0 = -local_29c; local_2a0 <= local_29c; local_2a0 = local_2a0 + 1) {
      std::make_pair<int&,int&>((int *)in_stack_fffffffffffffc88,(int *)0x13c9eb);
      for (local_2ac = 0; local_2ac < local_29c * 2 + 1; local_2ac = local_2ac + 1) {
        *(undefined8 *)((long)pvVar4 + (long)local_2ac * 8) = 0;
      }
      MATPACK::Wigner3jm(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                         in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                         in_stack_fffffffffffffe00);
      dVar6 = floor(local_288);
      iVar2 = (int)dVar6;
      pmVar5 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                             *)poVar3,__k);
      *pmVar5 = iVar2;
      dVar6 = floor(local_290);
      iVar2 = (int)dVar6;
      this_00 = (vector<double,_std::allocator<double>_> *)
                std::
                map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                              *)poVar3,__k);
      *(int *)&(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start = iVar2;
      for (local_2b0 = 0; local_2b0 <= (int)(local_290 - local_288); local_2b0 = local_2b0 + 1) {
        std::
        map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator[]((map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                      *)poVar3,__k);
        std::vector<double,_std::allocator<double>_>::push_back
                  (this_00,(value_type_conflict2 *)CONCAT44(iVar2,in_stack_fffffffffffffc98));
      }
    }
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  std::__cxx11::string::~string(local_268);
  std::__cxx11::stringstream::~stringstream(local_248);
  return;
}

Assistant:

BondOrderParameter::BondOrderParameter(SimInfo* info,
                                         const std::string& filename,
                                         const std::string& sele, double rCut,
                                         unsigned int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    setAnalysisType("Bond Order Parameters");
    setOutputName(getPrefix(filename) + ".bo");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // Set up cutoff radius and order of the Legendre Polynomial:

    rCut_  = rCut;
    nBins_ = nbins;

    std::stringstream params;
    params << " rcut = " << rCut_ << ", nbins = " << nBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    Qcount_.resize(lMax_ + 1);
    Wcount_.resize(lMax_ + 1);

    // Q can take values from 0 to 1

    MinQ_   = 0.0;
    MaxQ_   = 1.1;
    deltaQ_ = (MaxQ_ - MinQ_) / (nBins_);

    // W_6 for icosahedral clusters is 11 / sqrt(4199) = 0.169754, so we'll
    // use values for MinW_ and MaxW_ that are slightly larger than this:

    MinW_   = -1.1;
    MaxW_   = 1.1;
    deltaW_ = (MaxW_ - MinW_) / (nBins_);

    // Make arrays for Wigner3jm
    RealType* THRCOF = new RealType[2 * lMax_ + 1];
    // Variables for Wigner routine
    RealType lPass, m1Pass, m2m, m2M;
    int error, mSize;
    mSize = 2 * lMax_ + 1;

    for (int l = 0; l <= lMax_; l++) {
      lPass = (RealType)l;
      for (int m1 = -l; m1 <= l; m1++) {
        m1Pass = (RealType)m1;

        std::pair<int, int> lm = std::make_pair(l, m1);

        // Zero work array
        for (int ii = 0; ii < 2 * l + 1; ii++) {
          THRCOF[ii] = 0.0;
        }

        // Get Wigner coefficients
        Wigner3jm(lPass, lPass, lPass, m1Pass, m2m, m2M, THRCOF, mSize, error);

        m2Min[lm] = (int)floor(m2m);
        m2Max[lm] = (int)floor(m2M);

        for (int mmm = 0; mmm <= (int)(m2M - m2m); mmm++) {
          w3j[lm].push_back(THRCOF[mmm]);
        }
      }
    }
    delete[] THRCOF;
    THRCOF = NULL;
  }